

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

LY_ERR lyxml_next_attribute
                 (lyxml_ctx *xmlctx,char **prefix,size_t *prefix_len,char **name,size_t *name_len)

{
  byte bVar1;
  ly_in *plVar2;
  ly_ctx *ctx;
  LY_ERR LVar3;
  int iVar4;
  uint uVar5;
  LY_ERR LVar6;
  ly_bool dynamic;
  ly_bool ws_only;
  char *in;
  uint32_t c;
  size_t parsed;
  char *value;
  size_t value_len;
  ly_bool local_62;
  ly_bool local_61;
  char *local_60;
  uint local_54;
  size_t *local_50;
  size_t local_48;
  char *local_40;
  size_t local_38;
  
  local_50 = prefix_len;
  do {
    plVar2 = xmlctx->in;
    bVar1 = *plVar2->current;
    if (bVar1 < 0xd) {
      if (bVar1 != 9) {
        if (bVar1 != 10) break;
        plVar2->line = plVar2->line + 1;
      }
    }
    else if ((bVar1 != 0xd) && (bVar1 != 0x20)) break;
    ly_in_skip(plVar2,1);
  } while( true );
  LVar6 = LY_SUCCESS;
LAB_001a5caa:
  local_60 = xmlctx->in->current;
  LVar3 = LVar6;
  if ((*local_60 != '/') && (*local_60 != '>')) {
    if (*local_60 == '\0') {
      ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
LAB_001a5ee4:
      LVar3 = LY_EVALID;
    }
    else {
      LVar3 = ly_getutf8(&local_60,&local_54,&local_48);
      if (LVar3 != LY_SUCCESS) {
LAB_001a5e88:
        ctx = xmlctx->ctx;
        uVar5 = LY_VCODE_INSTREXP_len(local_60 + -local_48);
        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
                (ulong)uVar5,(long)local_60 - local_48,
                "element tag end (\'>\' or \'/>\') or an attribute");
        goto LAB_001a5ee4;
      }
      if (((local_54 != 0x5f) && (0x19 < (local_54 & 0xffffffdf) - 0x41)) &&
         (local_54 == 0x37e || 0x1c8f < local_54 - 0x370)) {
        if (((((0xdffff < local_54 - 0x10000) && (0x20d < local_54 - 0xfdf0)) &&
             ((0x4cf < local_54 - 0xf900 &&
              ((0xa7fe < local_54 - 0x3001 && (0x3ef < local_54 - 0x2c00)))))) &&
            (0x11f < local_54 - 0x2070)) &&
           (((local_54 & 0xfffffffe) != 0x200c &&
            (0x23f < local_54 - 0xc0 || (local_54 & 0xffffffdf) == 0xd7)))) goto LAB_001a5e88;
      }
      LVar3 = lyxml_parse_qname(xmlctx,prefix,local_50,name,name_len);
      if (((LVar3 == LY_SUCCESS) &&
          (((*prefix != (char *)0x0 && (iVar4 = ly_strncmp("xmlns",*prefix,*local_50), iVar4 == 0))
           || ((LVar3 = LVar6, *prefix == (char *)0x0 &&
               (iVar4 = ly_strncmp("xmlns",*name,*name_len), LVar3 = LY_SUCCESS, iVar4 == 0)))))) &&
         (LVar3 = lyxml_next_attr_content(xmlctx,&local_40,&local_38,&local_61,&local_62),
         LVar3 == LY_SUCCESS)) {
        if (local_62 != '\0') {
          free(local_40);
        }
        do {
          plVar2 = xmlctx->in;
          bVar1 = *plVar2->current;
          if (bVar1 < 0xd) {
            if (bVar1 != 9) {
              if (bVar1 != 10) goto LAB_001a5caa;
              plVar2->line = plVar2->line + 1;
            }
          }
          else if ((bVar1 != 0xd) && (bVar1 != 0x20)) goto LAB_001a5caa;
          ly_in_skip(plVar2,1);
        } while( true );
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lyxml_next_attribute(struct lyxml_ctx *xmlctx, const char **prefix, size_t *prefix_len, const char **name, size_t *name_len)
{
    const char *in;
    char *value;
    uint32_t c;
    size_t parsed, value_len;
    ly_bool ws_only, dynamic;

    /* skip WS */
    ign_xmlws(xmlctx);

    /* parse only possible attributes */
    while ((xmlctx->in->current[0] != '>') && (xmlctx->in->current[0] != '/')) {
        in = xmlctx->in->current;
        if (in[0] == '\0') {
            LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
            return LY_EVALID;
        } else if ((ly_getutf8(&in, &c, &parsed) || !is_xmlqnamestartchar(c))) {
            LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(in - parsed), in - parsed,
                    "element tag end ('>' or '/>') or an attribute");
            return LY_EVALID;
        }

        /* parse attribute name */
        LY_CHECK_RET(lyxml_parse_qname(xmlctx, prefix, prefix_len, name, name_len));

        if ((!*prefix || ly_strncmp("xmlns", *prefix, *prefix_len)) && (*prefix || ly_strncmp("xmlns", *name, *name_len))) {
            /* standard attribute */
            break;
        }

        /* namespace, skip it */
        LY_CHECK_RET(lyxml_next_attr_content(xmlctx, (const char **)&value, &value_len, &ws_only, &dynamic));
        if (dynamic) {
            free(value);
        }

        /* skip WS */
        ign_xmlws(xmlctx);
    }

    return LY_SUCCESS;
}